

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_basic.hpp
# Opt level: O2

void __thiscall lest::failure::failure(failure *this,location *where_,text *expr_)

{
  allocator local_a2;
  allocator local_a1;
  text local_a0;
  text local_80;
  text local_60;
  location local_40;
  
  std::__cxx11::string::string((string *)&local_60,"failed",&local_a1);
  location::location(&local_40,where_);
  std::__cxx11::string::string((string *)&local_80,(string *)expr_);
  std::__cxx11::string::string((string *)&local_a0,"",&local_a2);
  message::message(&this->super_message,&local_60,&local_40,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)&this->super_message = &PTR__message_00106c70;
  return;
}

Assistant:

failure( location where_, text expr_)
    : message{ "failed", where_, expr_} {}